

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_define_array.hpp
# Opt level: O2

void msgpack::v1::type::
     define_array_imp<std::tuple<int_const&,std::__cxx11::string_const&,int_const&>,3ul>::
     pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
               (packer<msgpack::v1::sbuffer> *pk,
               tuple<const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
               *t)

{
  define_array_imp<std::tuple<int_const&,std::__cxx11::string_const&,int_const&>,2ul>::
  pack<msgpack::v1::packer<msgpack::v1::sbuffer>>(pk,t);
  v1::operator<<(pk,(t->
                    super__Tuple_impl<0UL,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
                    ).
                    super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
                    .super__Tuple_impl<2UL,_const_int_&>.super__Head_base<2UL,_const_int_&,_false>.
                    _M_head_impl);
  return;
}

Assistant:

static void pack(Packer& pk, Tuple const& t) {
        define_array_imp<Tuple, N-1>::pack(pk, t);
        pk.pack(std::get<N-1>(t));
    }